

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  InternalRunDeathTestFlag *str;
  bool bVar4;
  UnitTestImpl *pUVar5;
  ExecDeathTest *this_00;
  String local_50;
  int local_3c;
  char *local_38;
  
  local_38 = file;
  pUVar5 = GetUnitTestImpl();
  str = (pUVar5->internal_run_death_test_flag_).ptr_;
  iVar2 = (pUVar5->current_test_info_->result_).death_test_count_;
  uVar1 = iVar2 + 1;
  (pUVar5->current_test_info_->result_).death_test_count_ = uVar1;
  if (str == (InternalRunDeathTestFlag *)0x0) {
LAB_00126252:
    bVar4 = String::operator==((String *)&FLAGS_gtest_death_test_style,"threadsafe");
    if (bVar4) {
      this_00 = (ExecDeathTest *)operator_new(0x40);
      ExecDeathTest::ExecDeathTest(this_00,statement,regex,local_38,line);
    }
    else {
      bVar4 = String::operator==((String *)&FLAGS_gtest_death_test_style,"fast");
      if (!bVar4) {
        String::Format((char *)&local_50,"Unknown death test style \"%s\" encountered",
                       FLAGS_gtest_death_test_style);
        DeathTest::set_last_death_test_message(&local_50);
LAB_0012631b:
        String::~String(&local_50);
        return false;
      }
      this_00 = (ExecDeathTest *)operator_new(0x30);
      NoExecDeathTest::NoExecDeathTest((NoExecDeathTest *)this_00,statement,regex);
    }
    *test = (DeathTest *)this_00;
  }
  else {
    if (str->index_ <= iVar2) {
      String::Format((char *)&local_50,
                     "Death test count (%d) somehow exceeded expected maximum (%d)",(ulong)uVar1);
      DeathTest::set_last_death_test_message(&local_50);
      goto LAB_0012631b;
    }
    local_3c = line;
    String::String(&local_50,&str->file_);
    bVar4 = String::operator==(&local_50,local_38);
    line = local_3c;
    if ((bVar4) && (str->line_ == local_3c)) {
      uVar3 = str->index_;
      String::~String(&local_50);
      if (uVar3 == uVar1) goto LAB_00126252;
    }
    else {
      String::~String(&local_50);
    }
    *test = (DeathTest *)0x0;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(String::Format(
          "Death test count (%d) somehow exceeded expected maximum (%d)",
          death_test_index, flag->index()));
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(String::Format(
        "Unknown death test style \"%s\" encountered",
        GTEST_FLAG(death_test_style).c_str()));
    return false;
  }